

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_iterator.cpp
# Opt level: O3

iterator * __thiscall
csv::CSVReader::iterator::operator++(iterator *__return_storage_ptr__,iterator *this,int param_1)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  size_t sVar2;
  bool bVar3;
  CSVReader *this_00;
  
  this_00 = this->daddy;
  __return_storage_ptr__->daddy = this_00;
  (__return_storage_ptr__->row).data.
  super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->row).data.super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  p_Var1 = (this->row).data.
           super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (__return_storage_ptr__->row).data.
  super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
      this_00 = this->daddy;
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (__return_storage_ptr__->row).row_length = (this->row).row_length;
  sVar2 = (this->row).fields_start;
  (__return_storage_ptr__->row).data_start = (this->row).data_start;
  (__return_storage_ptr__->row).fields_start = sVar2;
  __return_storage_ptr__->i = this->i;
  bVar3 = read_row(this_00,&this->row);
  if (!bVar3) {
    this->daddy = (CSVReader *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

CSV_INLINE CSVReader::iterator CSVReader::iterator::operator++(int) {
        auto temp = *this;
        if (!daddy->read_row(this->row)) {
            this->daddy = nullptr; // this == end()
        }

        return temp;
    }